

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

error fail(token *token,char *fmt,...)

{
  int iVar1;
  int iVar2;
  char in_AL;
  pointer pcVar3;
  undefined8 in_RCX;
  char *in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [24];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  unique_ptr<char[],_std::default_delete<char[]>_> local_60;
  undefined1 local_51;
  int local_50;
  int local_4c;
  int length;
  int second_length;
  va_list ap;
  int first_length;
  int column;
  int line;
  char *fmt_local;
  token *token_local;
  error *error;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  iVar1 = *(int *)(fmt + 0x1c);
  iVar2 = *(int *)(fmt + 0x20);
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  ap[0].reg_save_area._4_4_ =
       snprintf((char *)0x0,0,"\x1b[1m%s:\x1b[1m%d:%d: \x1b[1;31merror:\x1b[0m ",*(undefined8 *)fmt,
                (ulong)(iVar1 + 1U),(ulong)(iVar2 + 1U));
  ap[0].overflow_arg_area = local_128;
  ap[0]._0_8_ = &stack0x00000008;
  second_length = 0x30;
  length = 0x18;
  local_4c = vsnprintf((char *)0x0,0,in_RDX,&length);
  local_50 = ap[0].reg_save_area._4_4_ + 1 + local_4c;
  local_51 = 0;
  ::error::error((error *)token);
  std::make_unique<char[]>((size_t)&local_60);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::operator=
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)token,&local_60);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_60);
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)token);
  snprintf(pcVar3,(long)local_50,"\x1b[1m%s:\x1b[1m%d:%d: \x1b[1;31merror:\x1b[0m ",
           *(undefined8 *)fmt,(ulong)(iVar1 + 1U),(ulong)(iVar2 + 1U));
  ap[0].overflow_arg_area = local_128;
  ap[0]._0_8_ = &stack0x00000008;
  second_length = 0x30;
  length = 0x18;
  pcVar3 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                     ((unique_ptr<char[],_std::default_delete<char[]>_> *)token);
  vsnprintf(pcVar3 + ap[0].reg_save_area._4_4_,(long)(local_50 - ap[0].reg_save_area._4_4_),in_RDX,
            &length);
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)token;
}

Assistant:

error fail(const token& token, const char* fmt, ...)
{
    static const char errfmt[] = "\33[1m%s:\33[1m%d:%d: \33[1;31merror:\33[0m ";

    const int line = token.line + 1;
    const int column = token.column + 1;

    const int first_length = std::snprintf(NULL, 0, errfmt, token.filename, line, column);
    std::va_list ap;
    va_start(ap, fmt);
    const int second_length = std::vsnprintf(NULL, 0, fmt, ap);
    va_end(ap);

    const int length = first_length + second_length + 1;
    error error;
    error.message = std::make_unique<char[]>(length);

    std::snprintf(error.message.get(), length, errfmt, token.filename, line, column);
    va_start(ap, fmt);
    std::vsnprintf(error.message.get() + first_length, length - first_length, fmt, ap);
    va_end(ap);

    return error;
}